

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O2

void __thiscall twitter::zipkin::thrift::Span::printTo(Span *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_40;
  
  std::operator<<(out,"Span(");
  poVar1 = std::operator<<(out,"trace_id=");
  apache::thrift::to_string<long>(&local_40,&this->trace_id);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"name=");
  apache::thrift::to_string<std::__cxx11::string>(&local_40,(thrift *)&this->name,t);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"id=");
  apache::thrift::to_string<long>(&local_40,&this->id);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"parent_id=");
  if (((ushort)this->__isset & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_40,&this->parent_id);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"annotations=");
  apache::thrift::to_string<twitter::zipkin::thrift::Annotation>(&local_40,&this->annotations);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"binary_annotations=");
  apache::thrift::to_string<twitter::zipkin::thrift::BinaryAnnotation>
            (&local_40,&this->binary_annotations);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"debug=");
  if (((ushort)this->__isset & 0x40) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<bool>(&local_40,&this->debug);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"timestamp=");
  if (((ushort)this->__isset & 0x80) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_40,&this->timestamp);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"duration=");
  if (((this->__isset).field_0x1 & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_40,&this->duration);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"trace_id_high=");
  if (((this->__isset).field_0x1 & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_40,&this->trace_id_high);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void Span::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Span(";
  out << "trace_id=" << to_string(trace_id);
  out << ", " << "name=" << to_string(name);
  out << ", " << "id=" << to_string(id);
  out << ", " << "parent_id="; (__isset.parent_id ? (out << to_string(parent_id)) : (out << "<null>"));
  out << ", " << "annotations=" << to_string(annotations);
  out << ", " << "binary_annotations=" << to_string(binary_annotations);
  out << ", " << "debug="; (__isset.debug ? (out << to_string(debug)) : (out << "<null>"));
  out << ", " << "timestamp="; (__isset.timestamp ? (out << to_string(timestamp)) : (out << "<null>"));
  out << ", " << "duration="; (__isset.duration ? (out << to_string(duration)) : (out << "<null>"));
  out << ", " << "trace_id_high="; (__isset.trace_id_high ? (out << to_string(trace_id_high)) : (out << "<null>"));
  out << ")";
}